

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

int Gia_RsbFindNodeToRemove(Gia_RsbMan_t *p,int *pMinCost)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int Index;
  
  if (p->vObjs->nSize < 1) {
    iVar3 = 1000000000;
    iVar2 = -1;
  }
  else {
    iVar2 = -1;
    iVar3 = 1000000000;
    Index = 0;
    do {
      iVar1 = Gia_RsbRemovalCost(p,Index);
      if (iVar1 < iVar3) {
        iVar2 = Index;
      }
      if (iVar1 <= iVar3) {
        iVar3 = iVar1;
      }
      Index = Index + 1;
    } while (Index < p->vObjs->nSize);
  }
  if (pMinCost != (int *)0x0) {
    *pMinCost = iVar3;
  }
  return iVar2;
}

Assistant:

int Gia_RsbFindNodeToRemove( Gia_RsbMan_t * p, int * pMinCost )
{
    int i, iObj, iMin = -1, CostMin = ABC_INFINITY;
    Vec_IntForEachEntry( p->vObjs, iObj, i )
    {
        int Cost = Gia_RsbRemovalCost( p, i );
        if ( CostMin > Cost )
        {
            CostMin = Cost;
            iMin = i;
        }
    }
    if ( pMinCost )
        *pMinCost = CostMin;
    return iMin;
}